

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_deflatev(ucvector *out,uchar *in,size_t insize,LodePNGCompressSettings *settings)

{
  uint final_00;
  size_t datapos;
  size_t local_a0;
  size_t end;
  size_t start;
  undefined1 local_88 [4];
  uint final;
  Hash hash;
  size_t bp;
  size_t numdeflateblocks;
  size_t blocksize;
  size_t i;
  uint error;
  LodePNGCompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  ucvector *out_local;
  
  hash.zeros = (unsigned_short *)0x0;
  if (settings->btype < 3) {
    if (settings->btype == 0) {
      out_local._4_4_ = deflateNoCompression(out,in,insize);
    }
    else {
      numdeflateblocks = insize;
      if (settings->btype != 1) {
        numdeflateblocks = (insize >> 3) + 8;
        if (numdeflateblocks < 0x10000) {
          numdeflateblocks = 0x10000;
        }
        if (0x40000 < numdeflateblocks) {
          numdeflateblocks = 0x40000;
        }
      }
      bp = ((insize + numdeflateblocks) - 1) / numdeflateblocks;
      if (bp == 0) {
        bp = 1;
      }
      i._4_4_ = hash_init((Hash *)local_88,settings->windowsize);
      out_local._4_4_ = i._4_4_;
      if (i._4_4_ == 0) {
        for (blocksize = 0; blocksize != bp && i._4_4_ == 0; blocksize = blocksize + 1) {
          final_00 = (uint)(blocksize == bp - 1);
          datapos = blocksize * numdeflateblocks;
          local_a0 = datapos + numdeflateblocks;
          if (insize < local_a0) {
            local_a0 = insize;
          }
          if (settings->btype == 1) {
            i._4_4_ = deflateFixed(out,(size_t *)&hash.zeros,(Hash *)local_88,in,datapos,local_a0,
                                   settings,final_00);
          }
          else if (settings->btype == 2) {
            i._4_4_ = deflateDynamic(out,(size_t *)&hash.zeros,(Hash *)local_88,in,datapos,local_a0,
                                     settings,final_00);
          }
        }
        hash_cleanup((Hash *)local_88);
        out_local._4_4_ = i._4_4_;
      }
    }
  }
  else {
    out_local._4_4_ = 0x3d;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned lodepng_deflatev(ucvector* out, const unsigned char* in, size_t insize,
                                 const LodePNGCompressSettings* settings)
{
  unsigned error = 0;
  size_t i, blocksize, numdeflateblocks;
  size_t bp = 0; /*the bit pointer*/
  Hash hash;

  if(settings->btype > 2) return 61;
  else if(settings->btype == 0) return deflateNoCompression(out, in, insize);
  else if(settings->btype == 1) blocksize = insize;
  else /*if(settings->btype == 2)*/
  {
    /*on PNGs, deflate blocks of 65-262k seem to give most dense encoding*/
    blocksize = insize / 8 + 8;
    if(blocksize < 65536) blocksize = 65536;
    if(blocksize > 262144) blocksize = 262144;
  }

  numdeflateblocks = (insize + blocksize - 1) / blocksize;
  if(numdeflateblocks == 0) numdeflateblocks = 1;

  error = hash_init(&hash, settings->windowsize);
  if(error) return error;

  for(i = 0; i != numdeflateblocks && !error; ++i)
  {
    unsigned final = (i == numdeflateblocks - 1);
    size_t start = i * blocksize;
    size_t end = start + blocksize;
    if(end > insize) end = insize;

    if(settings->btype == 1) error = deflateFixed(out, &bp, &hash, in, start, end, settings, final);
    else if(settings->btype == 2) error = deflateDynamic(out, &bp, &hash, in, start, end, settings, final);
  }

  hash_cleanup(&hash);

  return error;
}